

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O2

void __thiscall
glslang::TIntermTraverser::incrementDepth(TIntermTraverser *this,TIntermNode *current)

{
  int iVar1;
  int iVar2;
  TIntermNode *local_8;
  
  iVar1 = this->depth;
  iVar2 = iVar1 + 1;
  this->depth = iVar2;
  if (iVar1 < this->maxDepth) {
    iVar2 = this->maxDepth;
  }
  this->maxDepth = iVar2;
  local_8 = current;
  std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::push_back
            (&(this->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>,
             &local_8);
  return;
}

Assistant:

void incrementDepth(TIntermNode *current)
    {
        depth++;
        maxDepth = (std::max)(maxDepth, depth);
        path.push_back(current);
    }